

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCEncoder.h
# Opt level: O0

int32_t __thiscall gnilk::IPCBinaryEncoder::WriteStr(IPCBinaryEncoder *this,string *value)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  char *pcVar4;
  int32_t ret;
  string *value_local;
  IPCBinaryEncoder *this_local;
  
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (value);
  iVar1 = (*(this->super_IPCEncoderBase).super_IPCWriter._vptr_IPCWriter[0xc])(this,sVar3 & 0xffff);
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (value);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (value);
  iVar2 = (**(this->super_IPCEncoderBase).super_IPCWriter._vptr_IPCWriter)(this,pcVar4,sVar3);
  return iVar2 + iVar1;
}

Assistant:

__inline int32_t WriteStr(const std::string &value) override {
            auto ret = WriteU16(value.size());
            ret += Write(value.data(), value.size());
            return ret;
        }